

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  string local_148 [8];
  string parameters_1;
  undefined1 local_120 [8];
  string parameters;
  string plugin_name;
  LogMessage local_d8;
  StringPiece local_a0;
  StringPiece local_90;
  StringPiece local_80 [2];
  StringPiece local_60;
  undefined1 local_50 [8];
  string error;
  GeneratorContext *generator_context_local;
  OutputDirective *output_directive_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  CommandLineInterface *this_local;
  
  error.field_2._8_8_ = generator_context;
  std::__cxx11::string::string((string *)local_50);
  if (output_directive->generator != (CodeGenerator *)0x0) {
    std::__cxx11::string::string(local_148,(string *)&output_directive->parameter);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&this->generator_parameters_,&output_directive->name);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::append((char *)local_148);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::append(local_148);
    }
    iVar2 = (*output_directive->generator->_vptr_CodeGenerator[4])();
    bVar1 = EnforceProto3OptionalSupport
                      (this,&output_directive->name,CONCAT44(extraout_var,iVar2),parsed_files);
    if (bVar1) {
      uVar3 = (*output_directive->generator->_vptr_CodeGenerator[3])
                        (output_directive->generator,parsed_files,local_148,error.field_2._8_8_,
                         local_50);
      if ((uVar3 & 1) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
        poVar6 = std::operator<<(poVar6,": ");
        poVar6 = std::operator<<(poVar6,(string *)local_50);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        parameters_1.field_2._12_4_ = 1;
      }
      else {
        parameters_1.field_2._12_4_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
      parameters_1.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string(local_148);
    goto joined_r0x0043ab6c;
  }
  plugin_name.field_2._M_local_buf[0xf] = '\0';
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_60,&output_directive->name);
  stringpiece_internal::StringPiece::StringPiece(local_80,"--");
  bVar1 = HasPrefixString(local_60,local_80[0]);
  if (bVar1) {
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_90,&output_directive->name);
    stringpiece_internal::StringPiece::StringPiece(&local_a0,"_out");
    bVar1 = HasSuffixString(local_90,local_a0);
    if (!bVar1) goto LAB_0043a6ad;
  }
  else {
LAB_0043a6ad:
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x85e);
    plugin_name.field_2._M_local_buf[0xf] = '\x01';
    pLVar4 = internal::LogMessage::operator<<
                       (&local_d8,
                        "CHECK failed: HasPrefixString(output_directive.name, \"--\") && HasSuffixString(output_directive.name, \"_out\"): "
                       );
    pLVar4 = internal::LogMessage::operator<<(pLVar4,"Bad name for plugin generator: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,&output_directive->name);
    internal::LogFinisher::operator=((LogFinisher *)(plugin_name.field_2._M_local_buf + 0xe),pLVar4)
    ;
  }
  if ((plugin_name.field_2._M_local_buf[0xf] & 1U) != 0) {
    internal::LogMessage::~LogMessage(&local_d8);
  }
  anon_unknown_4::PluginName
            ((string *)((long)&parameters.field_2 + 8),&this->plugin_prefix_,&output_directive->name
            );
  std::__cxx11::string::string((string *)local_120,(string *)&output_directive->parameter);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&this->plugin_parameters_,(key_type *)((long)&parameters.field_2 + 8));
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::append(local_120);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&this->plugin_parameters_,(key_type *)((long)&parameters.field_2 + 8));
    std::__cxx11::string::append((string *)local_120);
  }
  bVar1 = GeneratePluginOutput
                    (this,parsed_files,(string *)((long)&parameters.field_2 + 8),(string *)local_120
                     ,(GeneratorContext *)error.field_2._8_8_,(string *)local_50);
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
    poVar6 = std::operator<<(poVar6,": ");
    poVar6 = std::operator<<(poVar6,(string *)local_50);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  parameters_1.field_2._13_3_ = 0;
  parameters_1.field_2._M_local_buf[0xc] = !bVar1;
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)(parameters.field_2._M_local_buf + 8));
joined_r0x0043ab6c:
  if (parameters_1.field_2._12_4_ == 0) {
    this_local._7_1_ = 1;
    parameters_1.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  std::string error;
  if (output_directive.generator == NULL) {
    // This is a plugin.
    GOOGLE_CHECK(HasPrefixString(output_directive.name, "--") &&
          HasSuffixString(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    std::string plugin_name = PluginName(plugin_prefix_, output_directive.name);
    std::string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name, parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    std::string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!EnforceProto3OptionalSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(), parsed_files)) {
      return false;
    }

    if (!output_directive.generator->GenerateAll(parsed_files, parameters,
                                                 generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}